

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void resize_reset_rc(AV1_COMP *cpi,int resize_width,int resize_height,int prev_width,int prev_height
                    )

{
  long lVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  AV1_COMP *cpi_00;
  LAYER_CONTEXT *lc;
  AV1_COMP *in_stack_00000018;
  int tl;
  double tot_scale_change;
  int qindex;
  int active_worst_quality;
  int target_bits_per_frame;
  SVC *svc;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  
  lVar1 = *in_RDI;
  cpi_00 = (AV1_COMP *)((double)(in_ESI * in_EDX) / (double)(in_ECX * in_R8D));
  *(undefined4 *)((long)in_RDI + 0x9d35c) = 0;
  *(undefined4 *)(in_RDI + 0x13a6c) = 0;
  *(undefined4 *)((long)in_RDI + 0x9d364) = 0;
  *(undefined8 *)(lVar1 + 0xad38) = *(undefined8 *)(lVar1 + 0xac78);
  *(undefined8 *)(lVar1 + 0xad58) = *(undefined8 *)(lVar1 + 0xac78);
  iVar2 = av1_calc_pframe_target_size_one_pass_cbr
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (FRAME_UPDATE_TYPE)((uint)in_stack_ffffffffffffff9c >> 0x18));
  *(int *)((long)in_RDI + 0x60774) = iVar2;
  if ((double)cpi_00 <= 4.0) {
    if (1.0 < (double)cpi_00) {
      *(int *)(lVar1 + 0xacc0) = *(int *)(lVar1 + 0xacc0) + *(int *)((long)in_RDI + 0x6082c) >> 1;
    }
  }
  else {
    *(undefined4 *)(lVar1 + 0xacc0) = *(undefined4 *)((long)in_RDI + 0x6082c);
  }
  calc_active_worst_quality_no_stats_cbr(in_stack_00000018);
  iVar2 = av1_rc_regulate_q(cpi_00,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            (int)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  if (((double)cpi_00 < 1.0) && ((*(int *)((long)in_RDI + 0x6082c) * 0x5a) / 100 < iVar2)) {
    *(double *)(lVar1 + 0xad08) = *(double *)(lVar1 + 0xad08) * 0.85;
  }
  if (1.0 <= (double)cpi_00) {
    if (((double)cpi_00 < 4.0) && ((*(int *)(lVar1 + 0xacfc) * 0x82) / 100 < iVar2)) {
      *(double *)(lVar1 + 0xad08) = *(double *)(lVar1 + 0xad08) * 0.8;
    }
    if (iVar2 <= (*(int *)(lVar1 + 0xacfc) * 0x78) / 100) {
      *(double *)(lVar1 + 0xad08) = *(double *)(lVar1 + 0xad08) * 1.5;
    }
  }
  if (1 < *(int *)((long)in_RDI + 0x9d33c)) {
    for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x9d33c); iVar2 = iVar2 + 1) {
      lVar3 = in_RDI[0x13a91] +
              (long)((int)in_RDI[0x13a66] * *(int *)((long)in_RDI + 0x9d33c) + iVar2) * 0x3380;
      *(int *)(lVar3 + 0xf0) = (int)in_RDI[0xc10c];
      *(undefined8 *)(lVar3 + 0x2348) = *(undefined8 *)(lVar3 + 0x2288);
      *(undefined8 *)(lVar3 + 0x2368) = *(undefined8 *)(lVar3 + 0x2288);
      *(undefined8 *)(lVar3 + 0x2318) = *(undefined8 *)(lVar1 + 0xad08);
      *(undefined4 *)(lVar3 + 0x22d0) = *(undefined4 *)(lVar1 + 0xacc0);
    }
  }
  return;
}

Assistant:

static void resize_reset_rc(AV1_COMP *cpi, int resize_width, int resize_height,
                            int prev_width, int prev_height) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  SVC *const svc = &cpi->svc;
  int target_bits_per_frame;
  int active_worst_quality;
  int qindex;
  double tot_scale_change = (double)(resize_width * resize_height) /
                            (double)(prev_width * prev_height);
  // Disable the skip mv search for svc on resize frame.
  svc->skip_mvsearch_last = 0;
  svc->skip_mvsearch_gf = 0;
  svc->skip_mvsearch_altref = 0;
  // Reset buffer level to optimal, update target size.
  p_rc->buffer_level = p_rc->optimal_buffer_level;
  p_rc->bits_off_target = p_rc->optimal_buffer_level;
  rc->this_frame_target =
      av1_calc_pframe_target_size_one_pass_cbr(cpi, INTER_FRAME);
  target_bits_per_frame = rc->this_frame_target;
  if (tot_scale_change > 4.0)
    p_rc->avg_frame_qindex[INTER_FRAME] = rc->worst_quality;
  else if (tot_scale_change > 1.0)
    p_rc->avg_frame_qindex[INTER_FRAME] =
        (p_rc->avg_frame_qindex[INTER_FRAME] + rc->worst_quality) >> 1;
  active_worst_quality = calc_active_worst_quality_no_stats_cbr(cpi);
  qindex = av1_rc_regulate_q(cpi, target_bits_per_frame, rc->best_quality,
                             active_worst_quality, resize_width, resize_height);
  // If resize is down, check if projected q index is close to worst_quality,
  // and if so, reduce the rate correction factor (since likely can afford
  // lower q for resized frame).
  if (tot_scale_change < 1.0 && qindex > 90 * rc->worst_quality / 100)
    p_rc->rate_correction_factors[INTER_NORMAL] *= 0.85;
  // If resize is back up: check if projected q index is too much above the
  // previous index, and if so, reduce the rate correction factor
  // (since prefer to keep q for resized frame at least closet to previous q).
  // Also check if projected qindex is close to previous qindex, if so
  // increase correction factor (to push qindex higher and avoid overshoot).
  if (tot_scale_change >= 1.0) {
    if (tot_scale_change < 4.0 &&
        qindex > 130 * p_rc->last_q[INTER_FRAME] / 100)
      p_rc->rate_correction_factors[INTER_NORMAL] *= 0.8;
    if (qindex <= 120 * p_rc->last_q[INTER_FRAME] / 100)
      p_rc->rate_correction_factors[INTER_NORMAL] *= 1.5;
  }
  if (svc->number_temporal_layers > 1) {
    // Apply the same rate control reset to all temporal layers.
    for (int tl = 0; tl < svc->number_temporal_layers; tl++) {
      LAYER_CONTEXT *lc = NULL;
      lc = &svc->layer_context[svc->spatial_layer_id *
                                   svc->number_temporal_layers +
                               tl];
      lc->rc.resize_state = rc->resize_state;
      lc->p_rc.buffer_level = lc->p_rc.optimal_buffer_level;
      lc->p_rc.bits_off_target = lc->p_rc.optimal_buffer_level;
      lc->p_rc.rate_correction_factors[INTER_NORMAL] =
          p_rc->rate_correction_factors[INTER_NORMAL];
      lc->p_rc.avg_frame_qindex[INTER_FRAME] =
          p_rc->avg_frame_qindex[INTER_FRAME];
    }
  }
}